

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.h
# Opt level: O2

SourceContext * __thiscall google::protobuf::Enum::_internal_mutable_source_context(Enum *this)

{
  SourceContext *pSVar1;
  Arena *arena;
  
  pSVar1 = (this->field_0)._impl_.source_context_;
  if (pSVar1 != (SourceContext *)0x0) {
    return pSVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pSVar1 = (SourceContext *)Arena::DefaultConstruct<google::protobuf::SourceContext>(arena);
  (this->field_0)._impl_.source_context_ = pSVar1;
  return pSVar1;
}

Assistant:

inline ::google::protobuf::SourceContext* Enum::_internal_mutable_source_context() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.source_context_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::SourceContext>(GetArena());
    _impl_.source_context_ = reinterpret_cast<::google::protobuf::SourceContext*>(p);
  }
  return _impl_.source_context_;
}